

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpls.cpp
# Opt level: O1

Dims * adios2::utils::get_global_array_signature<int>
                 (Dims *__return_storage_ptr__,Engine *fp,IO *io,Variable<int> *variable)

{
  char cVar1;
  pointer puVar2;
  unsigned_long uVar3;
  pointer puVar4;
  bool bVar5;
  undefined8 uVar6;
  void *pvVar7;
  _Rb_tree_node_base *p_Var8;
  long lVar9;
  long lVar10;
  unsigned_long uVar11;
  bool bVar12;
  size_type __n;
  Dims d;
  allocator_type local_69;
  Dims *local_68;
  long local_60;
  pointer local_58;
  pointer puStack_50;
  pointer local_48;
  long local_40;
  long local_38;
  
  local_38 = *(long *)(variable + 0x58);
  local_40 = *(long *)(variable + 0x60);
  __n = local_40 - local_38 >> 3;
  local_58 = (pointer)0x0;
  local_68 = __return_storage_ptr__;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (__return_storage_ptr__,__n,(value_type_conflict1 *)&local_58,&local_69);
  if (timestep == '\x01') {
    adios2::core::VariableBase::Shape((ulong)&local_58);
    puVar2 = (local_68->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
             super__Vector_impl_data._M_start;
    (local_68->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
    super__Vector_impl_data._M_start = local_58;
    (local_68->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
    super__Vector_impl_data._M_finish = puStack_50;
    (local_68->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = local_48;
    local_58 = (pointer)0x0;
    puStack_50 = (pointer)0x0;
    local_48 = (pointer)0x0;
    if (puVar2 != (pointer)0x0) {
      operator_delete(puVar2);
    }
    if (local_58 != (pointer)0x0) {
      operator_delete(local_58);
    }
  }
  else {
    local_60 = adios2::core::VariableBase::GetAvailableStepsCount();
    uVar6 = (**(code **)(*(long *)fp + 0x20))(fp);
    pvVar7 = (void *)(**(code **)(*(long *)fp + 0x58))(fp,variable,uVar6);
    if (pvVar7 == (void *)0x0) {
      p_Var8 = *(_Rb_tree_node_base **)(variable + 0x170);
      if (local_60 != 0 && p_Var8 != (_Rb_tree_node_base *)(variable + 0x160)) {
        bVar12 = true;
        lVar9 = 0;
        do {
          adios2::core::VariableBase::Shape((ulong)&local_58);
          puVar2 = local_58;
          if (local_58 != puStack_50) {
            if (local_40 != local_38) {
              puVar4 = (local_68->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)
                       ._M_impl.super__Vector_impl_data._M_start;
              lVar10 = 0;
              do {
                if (bVar12) {
                  puVar4[lVar10] = local_58[lVar10];
                }
                else if (puVar4[lVar10] != local_58[lVar10]) {
                  puVar4[lVar10] = 0;
                }
                lVar10 = lVar10 + 1;
              } while (__n + (__n == 0) != lVar10);
            }
            p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8);
            bVar12 = false;
          }
          if (puVar2 != (pointer)0x0) {
            operator_delete(puVar2);
          }
          lVar9 = lVar9 + 1;
        } while (lVar9 != local_60);
      }
    }
    else if (local_60 != 0) {
      bVar12 = true;
      lVar9 = 0;
      do {
        if (lVar9 != 0) {
          pvVar7 = (void *)(**(code **)(*(long *)fp + 0x58))(fp,variable,lVar9);
        }
        uVar3 = *(unsigned_long *)((long)pvVar7 + 0x10);
        bVar5 = bVar12;
        if (uVar3 != 0) {
          bVar5 = false;
        }
        if (uVar3 != 0 && local_40 != local_38) {
          cVar1 = *(char *)((long)pvVar7 + 8);
          puVar2 = (local_68->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                   _M_impl.super__Vector_impl_data._M_start;
          lVar10 = 0;
          do {
            uVar11 = uVar3;
            if (cVar1 == '\0') {
              uVar11 = *(unsigned_long *)(uVar3 + lVar10 * 8);
            }
            if (bVar12) {
LAB_00130b2f:
              puVar2[lVar10] = uVar11;
            }
            else if (puVar2[lVar10] != uVar11) {
              uVar11 = 0;
              goto LAB_00130b2f;
            }
            lVar10 = lVar10 + 1;
          } while (__n + (__n == 0) != lVar10);
          bVar5 = false;
        }
        bVar12 = bVar5;
        if (pvVar7 != (void *)0x0) {
          if (*(void **)((long)pvVar7 + 0x20) != (void *)0x0) {
            operator_delete(*(void **)((long)pvVar7 + 0x20));
          }
          operator_delete(pvVar7);
        }
        lVar9 = lVar9 + 1;
      } while (lVar9 != local_60);
    }
  }
  return local_68;
}

Assistant:

Dims get_global_array_signature(core::Engine *fp, core::IO *io, core::Variable<T> *variable)
{
    const size_t ndim = variable->m_Shape.size();
    Dims dims(ndim, 0);
    if (timestep)
    {
        dims = variable->Shape();
    }
    else
    {
        const size_t nsteps = variable->GetAvailableStepsCount();
        bool firstStep = true;

        // looping over the absolute step indexes
        // is not supported by a simple API function
        auto minBlocks = fp->MinBlocksInfo(*variable, fp->CurrentStep());

        if (minBlocks)
        {
            for (size_t step = 0; step < nsteps; step++)
            {
                if (step > 0)
                {
                    minBlocks = fp->MinBlocksInfo(*variable, step);
                }
                if (minBlocks->Shape)
                {
                    for (size_t k = 0; k < ndim; k++)
                    {
                        size_t n =
                            (minBlocks->WasLocalValue ? reinterpret_cast<size_t>(minBlocks->Shape)
                                                      : minBlocks->Shape[k]);
                        if (firstStep)
                        {
                            dims[k] = n;
                        }
                        else if (dims[k] != n)
                        {
                            dims[k] = 0;
                        }
                    }
                    firstStep = false;
                }
                delete minBlocks;
            }
        }
        else
        {
            const std::map<size_t, std::vector<size_t>> &indices =
                variable->m_AvailableStepBlockIndexOffsets;
            auto itStep = indices.begin();
            if (itStep != indices.end())
            {
                for (size_t step = 0; step < nsteps; step++)
                {
                    const size_t absstep = itStep->first;
                    Dims d = variable->Shape(absstep - 1);
                    if (d.empty())
                    {
                        continue;
                    }

                    for (size_t k = 0; k < ndim; k++)
                    {
                        if (firstStep)
                        {
                            dims[k] = d[k];
                        }
                        else if (dims[k] != d[k])
                        {
                            dims[k] = 0;
                        }
                    }
                    firstStep = false;
                    ++itStep;
                }
            }
        }
    }
    return dims;
}